

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O3

int uv_fs_event_stop(uv_fs_event_t *handle)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  void **ppvVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  watcher_list *old;
  long *__ptr;
  int iVar11;
  long *plVar12;
  void **ppvVar13;
  long *plVar14;
  long lVar15;
  
  uVar2 = handle->flags;
  if ((uVar2 >> 0xe & 1) == 0) {
    return -0x16;
  }
  __ptr = (long *)handle->loop->inotify_watchers;
  if (__ptr != (long *)0x0) {
    do {
      if ((int)__ptr[7] <= handle->wd) {
        if (handle->wd <= (int)__ptr[7]) {
          handle->wd = -1;
          handle->filename = (char *)0x0;
          handle->flags = uVar2 & 0xffffbfff;
          if ((uVar2 >> 0xd & 1) != 0) {
            puVar1 = &handle->loop->active_handles;
            *puVar1 = *puVar1 - 1;
          }
          pvVar3 = handle->watchers[0];
          *(void **)handle->watchers[1] = pvVar3;
          *(void **)((long)pvVar3 + 8) = handle->watchers[1];
          if (__ptr + 4 != (long *)__ptr[4]) {
            return 0;
          }
          ppvVar7 = &handle->loop->inotify_watchers;
          plVar8 = (long *)__ptr[1];
          if ((long *)*__ptr == (long *)0x0) {
            plVar9 = (long *)__ptr[2];
            iVar11 = (int)__ptr[3];
            if (plVar8 != (long *)0x0) goto LAB_00114369;
            plVar8 = (long *)0x0;
          }
          else {
            if (plVar8 != (long *)0x0) goto LAB_001142cd;
            plVar9 = (long *)__ptr[2];
            iVar11 = (int)__ptr[3];
            plVar8 = (long *)*__ptr;
LAB_00114369:
            plVar8[2] = (long)plVar9;
          }
          ppvVar13 = ppvVar7;
          if (plVar9 != (long *)0x0) {
            ppvVar13 = (void **)(plVar9 + ((long *)*plVar9 != __ptr));
          }
          *ppvVar13 = plVar8;
          goto LAB_0011438a;
        }
        __ptr = __ptr + 1;
      }
      __ptr = (long *)*__ptr;
    } while (__ptr != (long *)0x0);
  }
  __assert_fail("w != NULL","src/unix/linux-inotify.c",0xed,"int uv_fs_event_stop(uv_fs_event_t *)")
  ;
LAB_001142cd:
  do {
    plVar12 = plVar8;
    plVar8 = (long *)*plVar12;
  } while ((long *)*plVar12 != (long *)0x0);
  plVar8 = (long *)plVar12[1];
  plVar9 = (long *)plVar12[2];
  iVar11 = (int)plVar12[3];
  if (plVar8 != (long *)0x0) {
    plVar8[2] = (long)plVar9;
  }
  ppvVar13 = ppvVar7;
  if (plVar9 != (long *)0x0) {
    ppvVar13 = (void **)(plVar9 + ((long *)*plVar9 != plVar12));
  }
  *ppvVar13 = plVar8;
  if ((long *)plVar12[2] == __ptr) {
    plVar9 = plVar12;
  }
  lVar15 = *__ptr;
  lVar5 = __ptr[1];
  lVar6 = __ptr[3];
  plVar12[2] = __ptr[2];
  plVar12[3] = lVar6;
  *plVar12 = lVar15;
  plVar12[1] = lVar5;
  puVar4 = (undefined8 *)__ptr[2];
  ppvVar13 = ppvVar7;
  if (puVar4 != (undefined8 *)0x0) {
    ppvVar13 = (void **)(puVar4 + ((long *)*puVar4 != __ptr));
  }
  *ppvVar13 = plVar12;
  *(long **)(*__ptr + 0x10) = plVar12;
  if (__ptr[1] != 0) {
    *(long **)(__ptr[1] + 0x10) = plVar12;
  }
LAB_0011438a:
  if (iVar11 == 0) {
    do {
      if ((plVar8 != (long *)0x0) && ((int)plVar8[3] != 0)) goto LAB_00114673;
      plVar12 = (long *)*ppvVar7;
      if (plVar8 == plVar12) goto LAB_0011466e;
      plVar14 = (long *)*plVar9;
      if (plVar14 == plVar8) {
        plVar8 = (long *)plVar9[1];
        plVar10 = plVar8;
        if ((int)plVar8[3] == 1) {
          *(undefined4 *)(plVar8 + 3) = 0;
          *(undefined4 *)(plVar9 + 3) = 1;
          plVar10 = (long *)*plVar8;
          plVar9[1] = (long)plVar10;
          if (plVar10 != (long *)0x0) {
            plVar10[2] = (long)plVar9;
          }
          puVar4 = (undefined8 *)plVar9[2];
          plVar8[2] = (long)puVar4;
          if (puVar4 == (undefined8 *)0x0) {
            *ppvVar7 = plVar8;
            plVar12 = plVar8;
          }
          else if (plVar9 == (long *)*puVar4) {
            *puVar4 = plVar8;
          }
          else {
            puVar4[1] = plVar8;
            plVar10 = (long *)plVar9[1];
          }
          *plVar8 = (long)plVar9;
          plVar9[2] = (long)plVar8;
        }
        plVar8 = (long *)*plVar10;
        if ((plVar8 == (long *)0x0) || ((int)plVar8[3] == 0)) {
          lVar15 = plVar10[1];
          if ((lVar15 == 0) || (*(int *)(lVar15 + 0x18) == 0)) goto LAB_00114499;
LAB_00114506:
          *(int *)(plVar10 + 3) = (int)plVar9[3];
          *(undefined4 *)(plVar9 + 3) = 0;
          plVar14 = plVar12;
LAB_0011462d:
          *(undefined4 *)(lVar15 + 0x18) = 0;
        }
        else {
          lVar15 = plVar10[1];
          if ((lVar15 != 0) && (*(int *)(lVar15 + 0x18) != 0)) goto LAB_00114506;
          *(undefined4 *)(plVar8 + 3) = 0;
          *(undefined4 *)(plVar10 + 3) = 1;
          lVar15 = plVar8[1];
          *plVar10 = lVar15;
          if (lVar15 != 0) {
            *(long **)(lVar15 + 0x10) = plVar10;
          }
          puVar4 = (undefined8 *)plVar10[2];
          plVar8[2] = (long)puVar4;
          plVar14 = plVar8;
          ppvVar13 = ppvVar7;
          if (puVar4 != (undefined8 *)0x0) {
            ppvVar13 = (void **)(puVar4 + (plVar10 != (long *)*puVar4));
            plVar14 = plVar12;
          }
          *ppvVar13 = plVar8;
          plVar8[1] = (long)plVar10;
          plVar10[2] = (long)plVar8;
          plVar10 = (long *)plVar9[1];
          lVar15 = plVar10[1];
          *(int *)(plVar10 + 3) = (int)plVar9[3];
          *(undefined4 *)(plVar9 + 3) = 0;
          if (lVar15 != 0) goto LAB_0011462d;
        }
        lVar15 = *plVar10;
        plVar9[1] = lVar15;
        if (lVar15 != 0) {
          *(long **)(lVar15 + 0x10) = plVar9;
        }
        puVar4 = (undefined8 *)plVar9[2];
        plVar10[2] = (long)puVar4;
        plVar8 = plVar10;
        if (puVar4 != (undefined8 *)0x0) {
          ppvVar7 = (void **)(puVar4 + (plVar9 != (long *)*puVar4));
          plVar8 = plVar14;
        }
        *ppvVar7 = plVar10;
        *plVar10 = (long)plVar9;
        goto LAB_0011466a;
      }
      plVar10 = plVar14;
      if ((int)plVar14[3] == 1) {
        *(undefined4 *)(plVar14 + 3) = 0;
        *(undefined4 *)(plVar9 + 3) = 1;
        plVar10 = (long *)plVar14[1];
        *plVar9 = (long)plVar10;
        if (plVar10 != (long *)0x0) {
          plVar10[2] = (long)plVar9;
        }
        puVar4 = (undefined8 *)plVar9[2];
        plVar14[2] = (long)puVar4;
        if (puVar4 == (undefined8 *)0x0) {
          *ppvVar7 = plVar14;
          plVar12 = plVar14;
        }
        else if (plVar9 == (long *)*puVar4) {
          *puVar4 = plVar14;
          plVar10 = (long *)*plVar9;
        }
        else {
          puVar4[1] = plVar14;
        }
        plVar14[1] = (long)plVar9;
        plVar9[2] = (long)plVar14;
      }
      lVar15 = *plVar10;
      if ((lVar15 != 0) && (*(int *)(lVar15 + 0x18) != 0)) goto LAB_001144d7;
      plVar8 = (long *)plVar10[1];
      if ((plVar8 != (long *)0x0) && ((int)plVar8[3] != 0)) goto LAB_001144cb;
LAB_00114499:
      *(undefined4 *)(plVar10 + 3) = 1;
      plVar8 = plVar9;
      plVar9 = (long *)plVar9[2];
    } while( true );
  }
  goto LAB_0011467b;
LAB_001144cb:
  if ((lVar15 == 0) || (*(int *)(lVar15 + 0x18) == 0)) {
    *(undefined4 *)(plVar8 + 3) = 0;
    *(undefined4 *)(plVar10 + 3) = 1;
    lVar15 = *plVar8;
    plVar10[1] = lVar15;
    if (lVar15 != 0) {
      *(long **)(lVar15 + 0x10) = plVar10;
    }
    puVar4 = (undefined8 *)plVar10[2];
    plVar8[2] = (long)puVar4;
    plVar14 = plVar8;
    ppvVar13 = ppvVar7;
    if (puVar4 != (undefined8 *)0x0) {
      ppvVar13 = (void **)(puVar4 + (plVar10 != (long *)*puVar4));
      plVar14 = plVar12;
    }
    *ppvVar13 = plVar8;
    *plVar8 = (long)plVar10;
    plVar10[2] = (long)plVar8;
    plVar10 = (long *)*plVar9;
    lVar15 = *plVar10;
    *(int *)(plVar10 + 3) = (int)plVar9[3];
    *(undefined4 *)(plVar9 + 3) = 0;
    if (lVar15 != 0) goto LAB_00114582;
  }
  else {
LAB_001144d7:
    *(int *)(plVar10 + 3) = (int)plVar9[3];
    *(undefined4 *)(plVar9 + 3) = 0;
    plVar14 = plVar12;
LAB_00114582:
    *(undefined4 *)(lVar15 + 0x18) = 0;
  }
  lVar15 = plVar10[1];
  *plVar9 = lVar15;
  if (lVar15 != 0) {
    *(long **)(lVar15 + 0x10) = plVar9;
  }
  puVar4 = (undefined8 *)plVar9[2];
  plVar10[2] = (long)puVar4;
  plVar8 = plVar10;
  if (puVar4 != (undefined8 *)0x0) {
    ppvVar7 = (void **)(puVar4 + (plVar9 != (long *)*puVar4));
    plVar8 = plVar14;
  }
  *ppvVar7 = plVar10;
  plVar10[1] = (long)plVar9;
LAB_0011466a:
  plVar9[2] = (long)plVar10;
LAB_0011466e:
  if (plVar8 != (long *)0x0) {
LAB_00114673:
    *(undefined4 *)(plVar8 + 3) = 0;
  }
LAB_0011467b:
  uv__inotify_rm_watch(handle->loop->inotify_fd,(int32_t)__ptr[7]);
  free(__ptr);
  return 0;
}

Assistant:

int uv_fs_event_stop(uv_fs_event_t* handle) {
  struct watcher_list* w;

  if (!uv__is_active(handle))
    return -EINVAL;

  w = find_watcher(handle->loop, handle->wd);
  assert(w != NULL);

  handle->wd = -1;
  handle->filename = NULL;
  uv__handle_stop(handle);
  QUEUE_REMOVE(&handle->watchers);

  if (QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&handle->loop->inotify_watchers), w);
    uv__inotify_rm_watch(handle->loop->inotify_fd, w->wd);
    free(w);
  }

  return 0;
}